

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

Aig_Man_t * Saig_ManWindowTest(Aig_Man_t *p)

{
  Aig_Obj_t *pObj;
  Aig_Man_t *pWnd_00;
  Aig_Man_t *pAVar1;
  Aig_Obj_t *pPivot;
  Aig_Man_t *pNew;
  Aig_Man_t *pWnd;
  int nDist;
  Aig_Man_t *p_local;
  
  pObj = Saig_ManFindPivot(p);
  if (pObj != (Aig_Obj_t *)0x0) {
    pWnd_00 = Saig_ManWindowExtract(p,pObj,3);
    pAVar1 = Saig_ManWindowInsert(p,pObj,3,pWnd_00);
    Aig_ManStop(pWnd_00);
    return pAVar1;
  }
  __assert_fail("pPivot != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                ,0x216,"Aig_Man_t *Saig_ManWindowTest(Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Saig_ManWindowTest( Aig_Man_t * p )
{
    int nDist = 3;
    Aig_Man_t * pWnd, * pNew;
    Aig_Obj_t * pPivot;
    pPivot = Saig_ManFindPivot( p );
    assert( pPivot != NULL );
    pWnd = Saig_ManWindowExtract( p, pPivot, nDist );
    pNew = Saig_ManWindowInsert( p, pPivot, nDist, pWnd );
    Aig_ManStop( pWnd );
    return pNew;
}